

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O3

int fits_get_section_range(char **ptr,long *secmin,long *secmax,long *incre,int *status)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  int isanumber;
  char *tstbuff;
  char token [71];
  int local_8c;
  char *local_88;
  long *local_80;
  char local_78 [72];
  
  local_88 = (char *)0x0;
  if (0 < *status) {
    return *status;
  }
  iVar2 = fits_get_token2(ptr," ,:",&local_88,&local_8c,status);
  pcVar5 = local_88;
  if (iVar2 == 0) {
    local_78[0] = '*';
    local_78[1] = '\0';
    local_80 = secmax;
LAB_00114d48:
    *secmin = 1;
    lVar4 = 0;
LAB_00114d51:
    *local_80 = lVar4;
    pcVar5 = *ptr;
    lVar4 = 1;
    if (*pcVar5 == ':') {
      *ptr = pcVar5 + 1;
      iVar2 = fits_get_token2(ptr," ,",&local_88,&local_8c,status);
      pcVar5 = local_88;
      if ((iVar2 == 0) || (local_8c == 0)) goto LAB_00114efa;
      sVar3 = strlen(local_88);
      if (0x46 < sVar3) goto LAB_00114cf8;
      strcpy(local_78,pcVar5);
      free(pcVar5);
      local_88 = (char *)0x0;
      lVar4 = atol(local_78);
      pcVar5 = *ptr;
    }
    *incre = lVar4;
    cVar1 = *pcVar5;
    pcVar6 = pcVar5;
    if (cVar1 == ',') {
      pcVar6 = pcVar5 + 1;
      *ptr = pcVar6;
      cVar1 = pcVar5[1];
    }
    while (cVar1 == ' ') {
      pcVar6 = pcVar6 + 1;
      *ptr = pcVar6;
      cVar1 = *pcVar6;
    }
    if ((-1 < *secmin) && (0 < lVar4 && -1 < *local_80)) {
      return *status;
    }
  }
  else {
    sVar3 = strlen(local_88);
    if (sVar3 < 0x47) {
      local_80 = secmax;
      strcpy(local_78,pcVar5);
      free(pcVar5);
      local_88 = (char *)0x0;
      if (local_78[0] == '*') goto LAB_00114d48;
      if ((local_78[0] == '-') && (local_78[1] == '*')) {
        *secmin = 0;
        lVar4 = 1;
        goto LAB_00114d51;
      }
      if ((local_8c == 0) || (pcVar5 = *ptr, *pcVar5 != ':')) goto LAB_00114f07;
      lVar4 = atol(local_78);
      *secmin = lVar4;
      *ptr = pcVar5 + 1;
      iVar2 = fits_get_token2(ptr," ,:",&local_88,&local_8c,status);
      pcVar5 = local_88;
      if ((iVar2 != 0) && (local_8c != 0)) {
        sVar3 = strlen(local_88);
        if (0x46 < sVar3) goto LAB_00114cf8;
        strcpy(local_78,pcVar5);
        free(pcVar5);
        local_88 = (char *)0x0;
        lVar4 = atol(local_78);
        goto LAB_00114d51;
      }
LAB_00114efa:
      pcVar5 = local_88;
      if (local_88 == (char *)0x0) goto LAB_00114f07;
    }
    else {
LAB_00114cf8:
      ffpmsg("Error: image section string too long (fits_get_section_range)");
    }
    free(pcVar5);
  }
LAB_00114f07:
  *status = 0x7d;
  return 0x7d;
}

Assistant:

int fits_get_section_range(char **ptr, 
                   long *secmin,
                   long *secmax, 
                   long *incre,
                   int *status)
/*
   Parse the input image section specification string, returning 
   the  min, max and increment values.
   Typical string =   "1:512:2"  or "1:512"
*/
{
    int slen, isanumber;
    char token[FLEN_VALUE], *tstbuff=0;

    if (*status > 0)
        return(*status);

    slen = fits_get_token2(ptr, " ,:", &tstbuff, &isanumber, status); /* get 1st token */
    if (slen==0)
    {
       /* support [:2,:2] type syntax, where the leading * is implied */
       strcpy(token,"*");
    }
    else
    {
       if (strlen(tstbuff) > FLEN_VALUE-1)
       {
          ffpmsg("Error: image section string too long (fits_get_section_range)");
          free(tstbuff);
          *status = URL_PARSE_ERROR;
          return(*status);
       }
       strcpy(token, tstbuff);
       free(tstbuff);
       tstbuff=0;
    }

    if (*token == '*')  /* wild card means to use the whole range */
    {
       *secmin = 1;
       *secmax = 0;
    }
    else if (*token == '-' && *(token+1) == '*' )  /* invert the whole range */
    {
       *secmin = 0;
       *secmax = 1;
    }
    else
    {
      if (slen == 0 || !isanumber || **ptr != ':')
        return(*status = URL_PARSE_ERROR);   

      /* the token contains the min value */
      *secmin = atol(token);

      (*ptr)++;  /* skip the colon between the min and max values */
      slen = fits_get_token2(ptr, " ,:", &tstbuff, &isanumber, status); /* get token */
      if (slen == 0 || !isanumber)
      {
        if (tstbuff)
           free(tstbuff);
        return(*status = URL_PARSE_ERROR);  
      } 
      if (strlen(tstbuff) > FLEN_VALUE-1)
      {
         ffpmsg("Error: image section string too long (fits_get_section_range)");
         free(tstbuff);
         *status = URL_PARSE_ERROR;
         return(*status);
      }
      strcpy(token, tstbuff);
      free(tstbuff);
      tstbuff=0;

      /* the token contains the max value */
      *secmax = atol(token);
    }

    if (**ptr == ':')
    {
        (*ptr)++;  /* skip the colon between the max and incre values */
        slen = fits_get_token2(ptr, " ,", &tstbuff, &isanumber, status); /* get token */
        if (slen == 0 || !isanumber)
        {
            if (tstbuff)
               free(tstbuff);
            return(*status = URL_PARSE_ERROR); 
        }  
        if (strlen(tstbuff) > FLEN_VALUE-1)
        {
           ffpmsg("Error: image section string too long (fits_get_section_range)");
           free(tstbuff);
           *status = URL_PARSE_ERROR;
           return(*status);
        }
        strcpy(token, tstbuff);
        free(tstbuff);
        tstbuff=0;


        *incre = atol(token);
    }
    else
        *incre = 1;  /* default increment if none is supplied */

    if (**ptr == ',')
        (*ptr)++;

    while (**ptr == ' ')   /* skip any trailing blanks */
         (*ptr)++;

    if (*secmin < 0 || *secmax < 0 || *incre < 1)
        *status = URL_PARSE_ERROR;

    return(*status);
}